

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  Expr *p;
  Vdbe *pVVar1;
  Index *pIVar2;
  WhereInfo *pWVar3;
  InLoop *__src;
  size_t __n;
  sqlite3 *db;
  Expr *pEVar4;
  ExprList *pEVar5;
  Parse *pParse_00;
  ExprList_item *pEVar6;
  int iVar7;
  WhereMemBlock *pWVar8;
  long lVar9;
  Expr *p_00;
  uint uVar10;
  int iVar11;
  Select *pSVar12;
  anon_union_4_2_6146edf4_for_u *paVar13;
  u8 uVar14;
  InLoop *pIVar15;
  Expr *pExpr;
  int op;
  ulong uVar16;
  ExprList_item *pEVar17;
  int p3;
  WhereLoop *pWVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  int iTab;
  int local_b4;
  ExprList *local_b0;
  Expr *local_a8;
  int local_9c;
  ExprList *local_98;
  sqlite3 *local_90;
  uint local_84;
  Parse *local_80;
  WhereLoop *local_78;
  int local_6c;
  Vdbe *local_68;
  WhereLevel *local_60;
  WhereTerm *local_58;
  ExprList *local_50;
  ExprList *local_48;
  ExprList_item *local_40;
  ExprList_item *local_38;
  
  p = pTerm->pExpr;
  uVar14 = p->op;
  if (uVar14 == '5') {
LAB_001a7dd0:
    iTarget = sqlite3ExprCodeTarget(pParse,p->pRight,iTarget);
    goto LAB_001a81c5;
  }
  pVVar1 = pParse->pVdbe;
  if (uVar14 == '2') {
    sqlite3VdbeAddOp3(pVVar1,0x4b,0,iTarget,0);
    goto LAB_001a81c5;
  }
  if (uVar14 == '-') goto LAB_001a7dd0;
  pWVar18 = pLevel->pWLoop;
  if ((((pWVar18->wsFlags & 0x400) == 0) &&
      (pIVar2 = (pWVar18->u).btree.pIndex, pIVar2 != (Index *)0x0)) &&
     (pIVar2->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  bVar21 = 0 < iEq;
  local_68 = pVVar1;
  if (0 < iEq) {
    uVar16 = 1;
    do {
      if ((pWVar18->aLTerm[uVar16 - 1] != (WhereTerm *)0x0) &&
         (pWVar18->aLTerm[uVar16 - 1]->pExpr == p)) {
        disableTerm(pLevel,pTerm);
        goto LAB_001a81be;
      }
      bVar21 = uVar16 < (uint)iEq;
      bVar22 = uVar16 != (uint)iEq;
      uVar16 = uVar16 + 1;
    } while (bVar22);
  }
  iVar7 = 0;
  if (iEq < (int)(uint)pWVar18->nLTerm) {
    uVar16 = (ulong)iEq;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(pWVar18->aLTerm[uVar16]->pExpr == p);
      uVar16 = uVar16 + 1;
    } while (pWVar18->nLTerm != uVar16);
  }
  local_b4 = 0;
  local_78 = (WhereLoop *)(long)iVar7;
  local_9c = iEq;
  local_84 = bRev;
  local_80 = pParse;
  local_6c = iTarget;
  local_60 = pLevel;
  local_58 = pTerm;
  if (((p->flags >> 0xc & 1) == 0) || (((p->x).pSelect)->pEList->nExpr == 1)) {
    local_b0 = (ExprList *)0x0;
LAB_001a7f08:
    iVar7 = sqlite3FindInIndex(pParse,p,4,(int *)0x0,&local_b0->nExpr,&local_b4);
  }
  else {
    if (((p->flags >> 0x19 & 1) != 0) && (p->iTable != 0)) {
      pSVar12 = (Select *)p->pLeft;
      uVar14 = pSVar12->op;
      if (uVar14 == 0xb0) {
        uVar14 = (u8)pSVar12->nSelectRow;
      }
      if (uVar14 == 0xb1) {
LAB_001a8229:
        iVar11 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
      }
      else {
        iVar11 = 1;
        if (uVar14 == 0x8a) {
          pSVar12 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pSelect;
          goto LAB_001a8229;
        }
      }
      if (iVar11 < iVar7) {
        iVar11 = iVar7;
      }
      local_b0 = (ExprList *)sqlite3DbMallocZero(pParse->db,(long)iVar11 << 2);
      goto LAB_001a7f08;
    }
    db = pParse->db;
    p_00 = exprDup(db,p,0,(u8 **)0x0);
    pParse_00 = local_80;
    local_a8 = p_00;
    local_90 = db;
    if (db->mallocFailed == '\0') {
      local_50 = ((p_00->x).pSelect)->pEList;
      local_48 = (p_00->pLeft->x).pList;
      if (local_9c < (int)(uint)pWVar18->nLTerm) {
        pEVar17 = local_50->a;
        local_40 = local_48->a;
        lVar19 = (long)local_9c;
        local_98 = (ExprList *)0x0;
        local_b0 = (ExprList *)0x0;
        local_38 = pEVar17;
        do {
          if (pWVar18->aLTerm[lVar19]->pExpr == p) {
            lVar20 = (long)(pWVar18->aLTerm[lVar19]->u).x.iField + -1;
            if (pEVar17[lVar20].pExpr != (Expr *)0x0) {
              local_98 = sqlite3ExprListAppend(pParse_00,local_98,pEVar17[lVar20].pExpr);
              pEVar6 = local_40;
              pEVar17[lVar20].pExpr = (Expr *)0x0;
              local_b0 = sqlite3ExprListAppend(pParse_00,local_b0,local_40[lVar20].pExpr);
              pEVar6[lVar20].pExpr = (Expr *)0x0;
              pEVar17 = local_38;
              p_00 = local_a8;
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (long)(ulong)pWVar18->nLTerm);
      }
      else {
        local_b0 = (ExprList *)0x0;
        local_98 = (ExprList *)0x0;
      }
      if (local_50 != (ExprList *)0x0) {
        exprListDeleteNN(local_90,local_50);
        p_00 = local_a8;
      }
      pTerm = local_58;
      pLevel = local_60;
      pParse = local_80;
      if (local_48 != (ExprList *)0x0) {
        exprListDeleteNN(local_90,local_48);
        p_00 = local_a8;
      }
      (p_00->pLeft->x).pList = local_b0;
      ((p_00->x).pSelect)->pEList = local_98;
      if ((local_b0 != (ExprList *)0x0) && (local_b0->nExpr == 1)) {
        pEVar4 = local_b0->a[0].pExpr;
        local_b0->a[0].pExpr = (Expr *)0x0;
        if (p_00->pLeft != (Expr *)0x0) {
          sqlite3ExprDeleteNN(local_90,p_00->pLeft);
          p_00 = local_a8;
        }
        p_00->pLeft = pEVar4;
        pParse = local_80;
      }
      pEVar5 = ((p_00->x).pSelect)->pOrderBy;
      if ((pEVar5 != (ExprList *)0x0) && (0 < pEVar5->nExpr)) {
        paVar13 = &pEVar5->a[0].u;
        lVar19 = 0;
        do {
          (paVar13->x).iOrderByCol = 0;
          lVar19 = lVar19 + 1;
          paVar13 = paVar13 + 6;
        } while (lVar19 < pEVar5->nExpr);
      }
    }
    if (local_90->mallocFailed == '\0') {
      local_b0 = (ExprList *)sqlite3DbMallocZero(pParse->db,(long)local_78 * 4);
      iVar7 = sqlite3FindInIndex(pParse,local_a8,4,(int *)0x0,(int *)local_b0,&local_b4);
      p->iTable = local_b4;
      p_00 = local_a8;
    }
    else {
      iVar7 = 5;
      local_b0 = (ExprList *)0x0;
    }
    if (p_00 != (Expr *)0x0) {
      sqlite3ExprDeleteNN(local_90,p_00);
    }
  }
  uVar10 = (uint)(local_84 == 0);
  if (iVar7 != 4) {
    uVar10 = local_84;
  }
  local_a8 = (Expr *)CONCAT44(local_a8._4_4_,uVar10);
  sqlite3VdbeAddOp3(local_68,(uint)(uVar10 == 0) * 4 + 0x20,local_b4,0,0);
  uVar10 = pWVar18->wsFlags;
  pWVar18->wsFlags = uVar10 | 0x800;
  if ((pLevel->u).in.nIn == 0) {
    iVar11 = local_80->nLabel + -1;
    local_80->nLabel = iVar11;
    pLevel->addrNxt = iVar11;
  }
  if ((0 < local_9c) && ((uVar10 & 0x100000) == 0)) {
    pWVar18->wsFlags = uVar10 | 0x40800;
  }
  local_98 = (ExprList *)(long)(pLevel->u).in.nIn;
  lVar19 = (long)&local_98->a[0].pExpr + (long)(local_78->aLTermSpace + -0xb);
  (pLevel->u).in.nIn = (int)lVar19;
  pWVar3 = pTerm->pWC->pWInfo;
  __src = (pLevel->u).in.aInLoop;
  local_84 = iVar7;
  pWVar8 = (WhereMemBlock *)sqlite3DbMallocRawNN(pWVar3->pParse->db,lVar19 * 0x14 + 0x10);
  if (pWVar8 == (WhereMemBlock *)0x0) {
    pIVar15 = (InLoop *)0x0;
  }
  else {
    pWVar8->pNext = pWVar3->pMemToFree;
    pWVar8->sz = lVar19 * 0x14;
    pWVar3->pMemToFree = pWVar8;
    pIVar15 = (InLoop *)(pWVar8 + 1);
  }
  if ((__src != (InLoop *)0x0) && (pIVar15 != (InLoop *)0x0)) {
    __n._0_4_ = __src[-1].nPrefix;
    __n._4_1_ = __src[-1].eEndLoopOp;
    __n._5_3_ = *(undefined3 *)&__src[-1].field_0x11;
    memcpy(pIVar15,__src,__n);
  }
  (local_60->u).in.aInLoop = pIVar15;
  if (pIVar15 == (InLoop *)0x0) {
    (local_60->u).in.nIn = 0;
    pLevel = local_60;
  }
  else {
    iVar7 = local_9c;
    if (local_9c < (int)(uint)pWVar18->nLTerm) {
      pIVar15 = pIVar15 + (long)local_98;
      local_90 = (sqlite3 *)(ulong)(uint)(local_6c - local_9c);
      local_98 = (ExprList *)(CONCAT71(local_98._1_7_,(int)local_a8 == 0) | 0x26);
      lVar20 = (long)local_9c;
      lVar19 = 0;
      local_a8 = (Expr *)((ulong)local_a8 & 0xffffffff00000000);
      iVar11 = local_6c;
      local_78 = pWVar18;
      do {
        pVVar1 = local_68;
        if (pWVar18->aLTerm[lVar20]->pExpr == p) {
          if (local_84 == 1) {
            op = 0x87;
            iVar7 = iVar11;
            p3 = 0;
          }
          else {
            if (local_b0 == (ExprList *)0x0) {
              iVar7 = 0;
            }
            else {
              lVar9 = (long)(int)local_a8;
              local_a8 = (Expr *)CONCAT44(local_a8._4_4_,(int)local_a8 + 1);
              iVar7 = *(int *)((long)local_b0->a + lVar9 * 4 + -8);
            }
            op = 0x5e;
            p3 = iVar11;
          }
          iVar7 = sqlite3VdbeAddOp3(local_68,op,local_b4,iVar7,p3);
          pIVar15->addrInTop = iVar7;
          sqlite3VdbeAddOp3(pVVar1,0x32,iVar11,0,0);
          if (lVar19 == 0) {
            pIVar15->iCur = local_b4;
            pIVar15->eEndLoopOp = (u8)local_98;
            if (local_9c < 1) {
              pIVar15->nPrefix = 0;
            }
            else {
              pIVar15->iBase = (int)local_90;
              pIVar15->nPrefix = (int)lVar20;
            }
          }
          else {
            pIVar15->eEndLoopOp = 0xb8;
          }
          pIVar15 = pIVar15 + 1;
          pWVar18 = local_78;
          iVar7 = local_9c;
        }
        lVar20 = lVar20 + 1;
        lVar19 = lVar19 + -1;
        iVar11 = iVar11 + 1;
      } while (lVar20 < (long)(ulong)pWVar18->nLTerm);
    }
    pLevel = local_60;
    if ((0 < iVar7) && ((pWVar18->wsFlags & 0x100400) == 0)) {
      sqlite3VdbeAddOp3(local_68,0x7d,local_60->iIdxCur,0,iVar7);
    }
  }
  pTerm = local_58;
  iTarget = local_6c;
  if (local_b0 != (ExprList *)0x0) {
    sqlite3DbFreeNN(local_80->db,local_b0);
  }
LAB_001a81be:
  if (bVar21) {
    return iTarget;
  }
LAB_001a81c5:
  if (((pLevel->pWLoop->wsFlags & 0x200000) == 0) || ((pTerm->eOperator & 0x800) == 0)) {
    disableTerm(pLevel,pTerm);
  }
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      Expr *pExpr = pTerm->pExpr;
      if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
        sqlite3 *db = pParse->db;
        pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
        if( !db->mallocFailed ){
          aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
          eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
          pExpr->iTable = iTab;
        }
        sqlite3ExprDelete(db, pX);
      }else{
        int n = sqlite3ExprVectorSize(pX->pLeft);
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
      }
      pX = pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);

    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }
    if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
      pLoop->wsFlags |= WHERE_IN_EARLYOUT;
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                           pLevel->u.in.aInLoop,
                           sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
      testcase( iEq>0
                && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
                && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
      if( iEq>0
       && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
      ){
        sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }

  /* As an optimization, try to disable the WHERE clause term that is
  ** driving the index as it will always be true.  The correct answer is
  ** obtained regardless, but we might get the answer with fewer CPU cycles
  ** by omitting the term.
  **
  ** But do not disable the term unless we are certain that the term is
  ** not a transitive constraint.  For an example of where that does not
  ** work, see https://sqlite.org/forum/forumpost/eb8613976a (2021-05-04)
  */
  if( (pLevel->pWLoop->wsFlags & WHERE_TRANSCONS)==0
   || (pTerm->eOperator & WO_EQUIV)==0
  ){
    disableTerm(pLevel, pTerm);
  }

  return iReg;
}